

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Vault::HttpClient::HttpClient(HttpClient *this,Config *config)

{
  this->_vptr_HttpClient = (_func_int **)&PTR__HttpClient_001c5aa8;
  Config::Config(&this->config_,config);
  *(undefined8 *)&(this->errorCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCallback_).super__Function_base._M_functor + 8) = 0;
  (this->errorCallback_)._M_invoker =
       std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:7:22)>
       ::_M_invoke;
  (this->errorCallback_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:7:22)>
       ::_M_manager;
  *(undefined8 *)&(this->responseErrorCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->responseErrorCallback_).super__Function_base._M_functor + 8) = 0;
  (this->responseErrorCallback_)._M_invoker =
       std::
       _Function_handler<void_(const_Vault::HttpResponse_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:8:30)>
       ::_M_invoke;
  (this->responseErrorCallback_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_Vault::HttpResponse_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/support/HttpClient.cpp:8:30)>
       ::_M_manager;
  return;
}

Assistant:

Vault::HttpClient::HttpClient(Vault::Config config)
    : config_(std::move(config)),
      errorCallback_([&]([[maybe_unused]] const std::string &err) {}),
      responseErrorCallback_([&]([[maybe_unused]] const HttpResponse &err) {}) {
}